

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.hpp
# Opt level: O0

size_t __thiscall FileAndMemReader::fileSize(FileAndMemReader *this)

{
  bool bVar1;
  size_t pos;
  size_t file_size;
  size_t old_pos;
  FileAndMemReader *this_local;
  
  bVar1 = isValid(this);
  if (bVar1) {
    if (this->m_fp == (FILE *)0x0) {
      this_local = (FileAndMemReader *)this->m_mp_size;
    }
    else {
      pos = tell(this);
      seek(this,0,2);
      this_local = (FileAndMemReader *)tell(this);
      seek(this,pos,0);
    }
  }
  else {
    this_local = (FileAndMemReader *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t fileSize()
    {
        if(!this->isValid())
            return 0;
        if(!m_fp)
            return m_mp_size; //Size of memory block is well known
        size_t old_pos = this->tell();
        seek(0l, FileAndMemReader::END);
        size_t file_size = this->tell();
        seek(static_cast<long>(old_pos), FileAndMemReader::SET);
        return file_size;
    }